

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O2

void __thiscall
sf2cute::SFPreset::SFPreset
          (SFPreset *this,string *name,uint16_t preset_number,uint16_t bank,
          vector<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_> *zones)

{
  pointer pSVar1;
  __uniq_ptr_data<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>,_true,_true>
  in_RAX;
  pointer *__ptr;
  pointer pSVar2;
  _Head_base<0UL,_sf2cute::SFPresetZone_*,_false> local_38;
  
  local_38._M_head_impl =
       (SFPresetZone *)
       in_RAX.
       super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>.
       _M_t.
       super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
       super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)this,(string *)name);
  this->preset_number_ = preset_number;
  this->bank_ = bank;
  this->library_ = 0;
  this->genre_ = 0;
  *(undefined8 *)&this->morphology_ = 0;
  *(undefined8 *)
   ((long)&(this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
           .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl + 4) = 0;
  *(undefined4 *)((long)&this->parent_file_ + 4) = 0;
  std::
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ::reserve(&this->zones_,
            ((long)(zones->
                   super__Vector_base<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(zones->
                  super__Vector_base<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>)
                  ._M_impl.super__Vector_impl_data._M_start) / 0x50);
  pSVar1 = (zones->super__Vector_base<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar2 = (zones->
                super__Vector_base<sf2cute::SFPresetZone,_std::allocator<sf2cute::SFPresetZone>_>).
                _M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    std::make_unique<sf2cute::SFPresetZone,sf2cute::SFPresetZone>
              ((SFPresetZone *)&stack0xffffffffffffffc8);
    std::
    vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>
              ((vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
                *)&this->zones_,
               (unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               &stack0xffffffffffffffc8);
    if (local_38._M_head_impl != (SFPresetZone *)0x0) {
      (**(code **)(*(_func_int **)local_38._M_head_impl + 8))();
    }
  }
  SetBackwardReferences(this);
  return;
}

Assistant:

SFPreset::SFPreset(std::string name,
    uint16_t preset_number,
    uint16_t bank,
    std::vector<SFPresetZone> zones) :
    name_(std::move(name)),
    preset_number_(std::move(preset_number)),
    bank_(std::move(bank)),
    library_(0),
    genre_(0),
    morphology_(0),
    zones_(),
    global_zone_(nullptr),
    parent_file_(nullptr) {
  // Set preset zones.
  zones_.reserve(zones.size());
  for (auto && zone : zones) {
    zones_.push_back(std::make_unique<SFPresetZone>(std::move(zone)));
  }

  // Repair references.
  SetBackwardReferences();
}